

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O0

uint __thiscall loser_tree<unsigned_char_*>::init_min(loser_tree<unsigned_char_*> *this,uint root)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint r;
  uint l;
  uint root_local;
  loser_tree<unsigned_char_*> *this_local;
  
  if (root < this->_stream_offset) {
    this_local._4_4_ = init_min(this,root << 1);
    uVar2 = init_min(this,root * 2 + 1);
    bVar1 = stream_empty(this,this->_streams + uVar2);
    if (bVar1) {
      this->_nodes[root] = uVar2;
    }
    else {
      bVar1 = stream_empty(this,this->_streams + this_local._4_4_);
      if (bVar1) {
        this->_nodes[root] = this_local._4_4_;
        this_local._4_4_ = uVar2;
      }
      else {
        iVar3 = cmp(*this->_streams[this_local._4_4_].stream,*this->_streams[uVar2].stream);
        if (iVar3 < 1) {
          this->_nodes[root] = uVar2;
        }
        else {
          this->_nodes[root] = this_local._4_4_;
          this_local._4_4_ = uVar2;
        }
      }
    }
  }
  else {
    this_local._4_4_ = root - this->_stream_offset;
  }
  return this_local._4_4_;
}

Assistant:

unsigned init_min(unsigned root)
	{
		if (root >= _stream_offset) { return root-_stream_offset; }
		//debug() << __PRETTY_FUNCTION__ << " root="<<root<<"\n";
		const unsigned l = init_min(root << 1);
		const unsigned r = init_min((root << 1) + 1);
		if (stream_empty(_streams[r])) {
			_nodes[root] = r;
			return l;
		}
		if (stream_empty(_streams[l])) {
			_nodes[root] = l;
			return r;
		}
		if (cmp(*(_streams[l].stream), *(_streams[r].stream)) <= 0) {
			_nodes[root] = r;
			return l;
		}
		_nodes[root] = l;
		return r;
	}